

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2LoadLabel(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = Insn >> 0xc & 0xf;
  if (uVar2 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if ((int)uVar1 < 0x966) {
      uVar3 = 0x9b9;
      if ((uVar1 != 0x94f) && (uVar1 != 0x95e)) goto LAB_001d6ca0;
    }
    else {
      if (uVar1 == 0x96e) {
        return MCDisassembler_Fail;
      }
      if (uVar1 != 0x966) goto LAB_001d6ca0;
      uVar3 = 0x9bd;
    }
    MCInst_setOpcode(Inst,uVar3);
  }
LAB_001d6ca0:
  uVar3 = Insn & 0xfff;
  uVar1 = MCInst_getOpcode(Inst);
  if ((uVar1 | 4) != 0x9bd) {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
  }
  uVar2 = 0x80000000;
  if (uVar3 != 0) {
    uVar2 = -uVar3;
  }
  if ((Insn >> 0x17 & 1) != 0) {
    uVar2 = uVar3;
  }
  MCOperand_CreateImm0(Inst,(long)(int)uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeT2LoadLabel(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	int imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBpci:
			case ARM_t2LDRHpci:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2LDRSBpci:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			case ARM_t2LDRSHpci:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch(MCInst_getOpcode(Inst)) {
		case ARM_t2PLDpci:
			break;
		case ARM_t2PLIpci:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!U) {
		// Special case for #-0.
		if (imm == 0)
			imm = INT32_MIN;
		else
			imm = -imm;
	}
	MCOperand_CreateImm0(Inst, imm);

	return S;
}